

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientUtils.cpp
# Opt level: O2

double ClientUtils::ComponentSign(Enum i_Direction)

{
  if (i_Direction < (Forward|Left)) {
    return *(double *)(&DAT_001604b8 + (ulong)i_Direction * 8);
  }
  __assert_fail("!\"Unknown enum value\"",
                "/workspace/llm4binary/github/license_c_cmakelists/whoenig[P]vicon-datastream-sdk/Vicon/CrossMarket/DataStream/ViconDataStreamSDKCoreUtils/ClientUtils.cpp"
                ,0x60,"double ClientUtils::ComponentSign(ViconDataStreamSDK::Core::Direction::Enum)"
               );
}

Assistant:

double ComponentSign( ViconDataStreamSDK::Core::Direction::Enum i_Direction )
  {
    switch( i_Direction )
    {
    case ViconDataStreamSDK::Core::Direction::Forward :
    case ViconDataStreamSDK::Core::Direction::Left    :
    case ViconDataStreamSDK::Core::Direction::Up      : return 1.0;
    case ViconDataStreamSDK::Core::Direction::Backward:
    case ViconDataStreamSDK::Core::Direction::Right   :
    case ViconDataStreamSDK::Core::Direction::Down    : return -1.0;
    default                                           : assert( !"Unknown enum value" );
                                                        return 0.0;
    }
  }